

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,char *fileName,int numThreads)

{
  bool bVar1;
  byte bVar2;
  void *pvVar3;
  long *plVar4;
  _func_int *p_Var5;
  GenericInputFile *in_RDI;
  Header *in_stack_00000058;
  DeepScanLineInputFile *in_stack_00000060;
  stringstream _iex_replace_s_1;
  int *in_stack_00000210;
  IStream *in_stack_00000218;
  Header *in_stack_00000220;
  BaseExc *e_1;
  stringstream _iex_replace_s;
  BaseExc *e;
  IStream *is;
  undefined1 in_stack_000016ce;
  undefined1 in_stack_000016cf;
  Header *in_stack_000016d0;
  InputStreamMutex *in_stack_fffffffffffffc00;
  IStream *in_stack_fffffffffffffc18;
  DeepScanLineInputFile *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  LineOrder in_stack_fffffffffffffc2c;
  StdIFStream *in_stack_fffffffffffffc30;
  Data *this_00;
  int *in_stack_ffffffffffffff60;
  IStream *in_stack_ffffffffffffff68;
  GenericInputFile *in_stack_ffffffffffffff70;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__DeepScanLineInputFile_0374bcc0;
  this_00 = (Data *)(in_RDI + 1);
  pvVar3 = operator_new(0x208);
  Data::Data(this_00,(int)((ulong)in_RDI >> 0x20));
  (this_00->super_Mutex).super___mutex_base._M_mutex.__align = (long)pvVar3;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x40) = 1;
  plVar4 = (long *)operator_new(0x38);
  StdIFStream::StdIFStream
            (in_stack_fffffffffffffc30,
             (char *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  GenericInputFile::readMagicNumberAndVersionField
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  bVar1 = isMultiPart(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc));
  if (bVar1) {
    compatibilityInitialize(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  }
  else {
    p_Var5 = (_func_int *)operator_new(0x38);
    InputStreamMutex::InputStreamMutex(in_stack_fffffffffffffc00);
    in_RDI[1]._vptr_GenericInputFile[0x3f] = p_Var5;
    *(long **)(in_RDI[1]._vptr_GenericInputFile[0x3f] + 0x28) = plVar4;
    bVar2 = (**(code **)(*plVar4 + 0x10))();
    *(byte *)(in_RDI[1]._vptr_GenericInputFile + 0x30) = bVar2 & 1;
    Header::readFrom(in_stack_00000220,in_stack_00000218,in_stack_00000210);
    isTiled(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xc));
    Header::sanityCheck(in_stack_000016d0,(bool)in_stack_000016cf,(bool)in_stack_000016ce);
    initialize(in_stack_00000060,in_stack_00000058);
    anon_unknown_6::readLineOffsets
              (&in_stack_fffffffffffffc30->super_IStream,in_stack_fffffffffffffc2c,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc20,
               (bool *)in_stack_fffffffffffffc18);
  }
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile
    (const char fileName[], int numThreads)
:
     _data (new Data (numThreads))
{
    _data->_deleteStream = true;
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream* is = 0;

    try
    {
        is = new StdIFStream (fileName);
        readMagicNumberAndVersionField(*is, _data->version);
        //
        // Backward compatibility to read multpart file.
        // multiPartInitialize will create _streamData
        if (isMultiPart(_data->version))
        {
            compatibilityInitialize(*is);
            return;
        }
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (is)          delete is;
        if (_data)       delete _data;

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << fileName << "\". " << e.what());
        throw;
    }

    // 
    // not multiPart - allocate stream data and intialise as normal
    //
    try
    { 
        _data->_streamData = new InputStreamMutex();
        _data->_streamData->is = is;
        _data->memoryMapped = is->isMemoryMapped();
        _data->header.readFrom (*_data->_streamData->is, _data->version);
        _data->header.sanityCheck (isTiled (_data->version));

        initialize(_data->header);

        readLineOffsets (*_data->_streamData->is,
                         _data->lineOrder,
                         _data->lineOffsets,
                         _data->fileIsComplete);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (is)          delete is;
        if (_data && _data->_streamData)
        {
            delete _data->_streamData;
        }
        if (_data)       delete _data;

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << fileName << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        if (is)          delete is;
        if (_data && _data->_streamData)
        {
            delete _data->_streamData;
        }
        if (_data)       delete _data;

        throw;
    }
}